

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void rw::ps2::genericUninstanceCB
               (MatPipeline *pipe,Geometry *geo,uint32 *flags,Mesh *mesh,uint8 **data)

{
  PipeAttribute *pPVar1;
  float32 *local_f8;
  float32 *local_e8;
  int local_d4;
  int local_d0;
  int32 idx;
  int j;
  uint32 i_1;
  Vertex v;
  uint32 mask;
  int32 i;
  PipeAttribute *a;
  Skin *skin;
  int8 *adc;
  uint32 *weights;
  int8 *normals;
  uint8 *rgba;
  float32 *uv2;
  float32 *uv;
  float32 *xyzw;
  float32 *xyz;
  uint8 **data_local;
  Mesh *mesh_local;
  uint32 *flags_local;
  Geometry *geo_local;
  MatPipeline *pipe_local;
  
  xyzw = (float32 *)0x0;
  uv = (float32 *)0x0;
  uv2 = (float32 *)0x0;
  rgba = (uint8 *)0x0;
  normals = (int8 *)0x0;
  weights = (uint32 *)0x0;
  adc = (int8 *)0x0;
  skin = (Skin *)0x0;
  a = (PipeAttribute *)0x0;
  if (skinGlobals != 0) {
    a = (PipeAttribute *)Skin::get(geo);
  }
  v.i[0] = '\0';
  v.i[1] = '\0';
  v.i[2] = '\0';
  v.i[3] = '\0';
  for (; (int)v.i < 10; v.i = (uint8  [4])((int)v.i + 1)) {
    pPVar1 = pipe->attribs[(int)v.i];
    if (pPVar1 != (PipeAttribute *)0x0) {
      if (pPVar1 == (PipeAttribute *)attribXYZ) {
        xyzw = (float32 *)data[(int)v.i];
      }
      else if (pPVar1 == (PipeAttribute *)attribXYZW) {
        uv = (float32 *)data[(int)v.i];
      }
      else if (pPVar1 == (PipeAttribute *)attribUV) {
        uv2 = (float32 *)data[(int)v.i];
      }
      else if (pPVar1 == (PipeAttribute *)attribUV2) {
        rgba = data[(int)v.i];
      }
      else if (pPVar1 == (PipeAttribute *)attribRGBA) {
        normals = (int8 *)data[(int)v.i];
      }
      else if (pPVar1 == (PipeAttribute *)attribNormal) {
        weights = (uint32 *)data[(int)v.i];
      }
      else if (pPVar1 == (PipeAttribute *)attribWeights) {
        adc = (int8 *)data[(int)v.i];
      }
    }
  }
  v.w[3] = 1.4013e-45;
  if ((weights != (uint32 *)0x0) && ((geo->flags & 0x10) != 0)) {
    v.w[3] = 2.38221e-44;
  }
  if ((normals != (int8 *)0x0) && ((geo->flags & 8) != 0)) {
    v.w[3] = (float32)((uint)v.w[3] | 0x100);
  }
  if (((uv2 != (float32 *)0x0) || (rgba != (uint8 *)0x0)) && (0 < geo->numTexCoordSets)) {
    v.w[3] = (float32)((uint)v.w[3] | 0x1000);
  }
  if ((rgba != (uint8 *)0x0) && (1 < geo->numTexCoordSets)) {
    v.w[3] = (float32)((uint)v.w[3] | 0x2000);
  }
  if ((adc != (int8 *)0x0) && (a != (PipeAttribute *)0x0)) {
    v.w[3] = (float32)((uint)v.w[3] | 0x10000);
  }
  if (uv != (float32 *)0x0) {
    skin = (Skin *)getADCbitsForMesh(geo,mesh);
  }
  for (idx = 0; (uint)idx < mesh->numIndices; idx = idx + 1) {
    if (((uint)v.w[3] & 1) != 0) {
      if (xyzw == (float32 *)0x0) {
        local_e8 = uv;
      }
      else {
        local_e8 = xyzw;
      }
      j = local_e8[0];
      unique0x00012004 = local_e8[1];
      v.p.x = local_e8[2];
    }
    if (((uint)v.w[3] & 0x10) != 0) {
      v.t1.v = (float32)((float)(int)(char)*weights / 128.0);
      v.c = (RGBA)((float)(int)*(char *)((long)weights + 1) / 128.0);
      v.n.x = (float32)((float)(int)*(char *)((long)weights + 2) / 128.0);
    }
    if (((uint)v.w[3] & 0x100) != 0) {
      v.t1.u = *(float32 *)normals;
    }
    if (((uint)v.w[3] & 0x1000) != 0) {
      if (uv2 == (float32 *)0x0) {
        local_f8 = (float32 *)rgba;
      }
      else {
        local_f8 = uv2;
      }
      v.p.y = local_f8[0];
      v.p.z = local_f8[1];
    }
    if (((uint)v.w[3] & 0x2000) != 0) {
      v.t = *(TexCoords *)(rgba + 8);
    }
    if (((uint)v.w[3] & 0x10000) != 0) {
      for (local_d0 = 0; local_d0 < 4; local_d0 = local_d0 + 1) {
        v.w[(long)local_d0 + -2] = (float32)(*(uint *)(adc + (long)local_d0 * 4) & 0xfffffc00);
        *(char *)((long)v.w + (long)local_d0 + 8) =
             (char)((*(uint *)(adc + (long)local_d0 * 4) & 0x3ff) >> 2);
        if (*(char *)((long)v.w + (long)local_d0 + 8) != '\0') {
          *(char *)((long)v.w + (long)local_d0 + 8) = *(char *)((long)v.w + (long)local_d0 + 8) + -1
          ;
        }
        if (((float)v.w[(long)local_d0 + -2] == 0.0) && (!NAN((float)v.w[(long)local_d0 + -2]))) {
          *(undefined1 *)((long)v.w + (long)local_d0 + 8) = 0;
        }
      }
    }
    local_d4 = findVertexSkin(geo,flags,(uint32)v.w[3],(Vertex *)&j);
    if (local_d4 < 0) {
      local_d4 = geo->numVertices;
      geo->numVertices = local_d4 + 1;
    }
    mesh->indices[(uint)idx] = (uint16)local_d4;
    if (skin != (Skin *)0x0) {
      *(bool *)((long)&skin->numBones + (ulong)(uint)idx) = (float)uv[3] != 0.0;
    }
    flags[local_d4] = (uint32)v.w[3];
    insertVertexSkin(geo,local_d4,(uint32)v.w[3],(Vertex *)&j);
    if (xyzw != (float32 *)0x0) {
      xyzw = xyzw + 3;
    }
    if (uv != (float32 *)0x0) {
      uv = uv + 4;
    }
    if (uv2 != (float32 *)0x0) {
      uv2 = uv2 + 2;
    }
    if (rgba != (uint8 *)0x0) {
      rgba = rgba + 0x10;
    }
    normals = normals + 4;
    weights = (uint32 *)((long)weights + 3);
    adc = adc + 0x10;
  }
  return;
}

Assistant:

void
genericUninstanceCB(MatPipeline *pipe, Geometry *geo, uint32 flags[], Mesh *mesh, uint8 *data[])
{
	float32 *xyz = nil, *xyzw = nil;
	float32 *uv = nil, *uv2 = nil;
	uint8 *rgba = nil;
	int8 *normals = nil;
	uint32 *weights = nil;
	int8 *adc = nil;
	Skin *skin = nil;
	if(skinGlobals.geoOffset)
		skin = Skin::get(geo);

	PipeAttribute *a;
	for(int32 i = 0; i < (int)nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i])){
			if(a == &attribXYZ) xyz = (float32*)data[i];
			else if(a == &attribXYZW) xyzw = (float32*)data[i];
			else if(a == &attribUV) uv = (float32*)data[i];
			else if(a == &attribUV2) uv2 = (float32*)data[i];
			else if(a == &attribRGBA) rgba = data[i];
			else if(a == &attribNormal) normals = (int8*)data[i];
			else if(a == &attribWeights) weights = (uint32*)data[i];
		}

	uint32 mask = 0x1;	// vertices
	if(normals && geo->flags & Geometry::NORMALS)
		mask |= 0x10;
	if(rgba && geo->flags & Geometry::PRELIT)
		mask |= 0x100;
	if((uv || uv2) && geo->numTexCoordSets > 0)
		mask |= 0x1000;
	if(uv2 && geo->numTexCoordSets > 1)
		mask |= 0x2000;
	if(weights && skin)
		mask |= 0x10000;
	if(xyzw)
		adc = getADCbitsForMesh(geo, mesh);

	Vertex v;
	for(uint32 i = 0; i < mesh->numIndices; i++){
		if(mask & 0x1)
			memcpy(&v.p, xyz ? xyz : xyzw, 12);
		if(mask & 0x10){
			// TODO: figure out scaling :/
			v.n.x = normals[0]/128.0f;
			v.n.y = normals[1]/128.0f;
			v.n.z = normals[2]/128.0f;
		}
		if(mask & 0x100)
			memcpy(&v.c, rgba, 4);
		if(mask & 0x1000)
			memcpy(&v.t, uv ? uv : uv2, 8);
		if(mask & 0x2000)
			memcpy(&v.t1, uv2 + 2, 8);
		if(mask & 0x10000)
			for(int j = 0; j < 4; j++){
				((uint32*)v.w)[j] = weights[j] & ~0x3FF;
				v.i[j] = (weights[j] & 0x3FF) >> 2;
				if(v.i[j]) v.i[j]--;
				if(v.w[j] == 0.0f) v.i[j] = 0;
			}
		int32 idx = findVertexSkin(geo, flags, mask, &v);
		if(idx < 0)
			idx = geo->numVertices++;
		mesh->indices[i] = idx;
		if(adc)
			adc[i] = xyzw[3] != 0.0f;
		flags[idx] = mask;
		insertVertexSkin(geo, idx, mask, &v);
		if(xyz) xyz += 3;
		if(xyzw) xyzw += 4;
		if(uv) uv += 2;
		if(uv2) uv2 += 4;
		rgba += 4;
		normals += 3;
		weights += 4;
	}
}